

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat32 *
fetchRGBToRGB32F<(QImage::Format)7>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  ushort uVar1;
  long lVar2;
  
  if (0 < count) {
    lVar2 = 0;
    do {
      uVar1 = *(ushort *)(src + lVar2 + (long)index * 2);
      *(ulong *)(&buffer->r + lVar2 * 2) =
           CONCAT44((float)(ushort)(uVar1 >> 9 & 3 | (ushort)(((uVar1 & 0x7e0) << 5) >> 8)) *
                    0.003921569,(float)((uint)(uVar1 >> 0xb) * 0x84000 >> 0x10) * 0.003921569);
      *(ulong *)(&buffer->r + lVar2 * 2 + 2) =
           CONCAT44(0x3f800000,(float)((uVar1 >> 2 & 7) + uVar1 * 8 & 0xff) * 0.003921569);
      lVar2 = lVar2 + 2;
    } while ((ulong)(uint)count * 2 != lVar2);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGBToRGB32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32F<Format>(fetchPixel<bitsPerPixel<Format>()>(src, index + i));
    return buffer;
}